

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bn_word.c
# Opt level: O0

int BN_add_word(BIGNUM *a,ulong w)

{
  bool bVar1;
  int iVar2;
  BIGNUM *pBVar3;
  int i;
  unsigned_long l;
  BIGNUM *in_stack_ffffffffffffffe0;
  BIGNUM *local_18;
  int local_4;
  
  if (w == 0) {
    local_4 = 1;
  }
  else {
    iVar2 = BN_is_zero((BIGNUM *)a);
    if (iVar2 == 0) {
      if (a->neg == 0) {
        iVar2 = 0;
        local_18 = (BIGNUM *)w;
        while( true ) {
          bVar1 = false;
          if (local_18 != (BIGNUM *)0x0) {
            bVar1 = iVar2 < a->top;
          }
          if (!bVar1) break;
          in_stack_ffffffffffffffe0 = (BIGNUM *)((long)&local_18->d + a->d[iVar2]);
          a->d[iVar2] = (ulong)in_stack_ffffffffffffffe0;
          local_18 = (BIGNUM *)(long)(int)(uint)(in_stack_ffffffffffffffe0 < local_18);
          iVar2 = iVar2 + 1;
        }
        if ((local_18 != (BIGNUM *)0x0) && (iVar2 == a->top)) {
          pBVar3 = bn_wexpand(in_stack_ffffffffffffffe0,iVar2);
          if (pBVar3 == (BIGNUM *)0x0) {
            return 0;
          }
          a->top = a->top + 1;
          a->d[iVar2] = (ulong)local_18;
        }
        local_4 = 1;
      }
      else {
        a->neg = 0;
        local_4 = BN_sub_word(a,w);
        iVar2 = BN_is_zero((BIGNUM *)a);
        if (iVar2 == 0) {
          a->neg = (uint)((a->neg != 0 ^ 0xffU) & 1);
        }
      }
    }
    else {
      local_4 = BN_set_word(a,w);
    }
  }
  return local_4;
}

Assistant:

int BN_add_word(BIGNUM *a, BN_ULONG w)
{
    BN_ULONG l;
    int i;

    bn_check_top(a);
    w &= BN_MASK2;

    /* degenerate case: w is zero */
    if (!w)
        return 1;
    /* degenerate case: a is zero */
    if (BN_is_zero(a))
        return BN_set_word(a, w);
    /* handle 'a' when negative */
    if (a->neg) {
        a->neg = 0;
        i = BN_sub_word(a, w);
        if (!BN_is_zero(a))
            a->neg = !(a->neg);
        return i;
    }
    for (i = 0; w != 0 && i < a->top; i++) {
        a->d[i] = l = (a->d[i] + w) & BN_MASK2;
        w = (w > l) ? 1 : 0;
    }
    if (w && i == a->top) {
        if (bn_wexpand(a, a->top + 1) == NULL)
            return 0;
        a->top++;
        a->d[i] = w;
    }
    bn_check_top(a);
    return 1;
}